

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O1

void __thiscall
ObjTable<QPDFWriter::Object>::resize(ObjTable<QPDFWriter::Object> *this,size_t a_size)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  pointer pOVar3;
  iterator __position;
  size_t sVar4;
  
  std::vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>::resize
            (&this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>,a_size);
  if (this->min_sparse < a_size) {
    __position._M_node =
         (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      do {
        uVar2 = *(ulong *)(__position._M_node + 1);
        if (a_size <= uVar2) break;
        pOVar3 = (this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                 super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pOVar3[uVar2].object_stream = *(int *)&__position._M_node[1]._M_left;
        *(_Base_ptr *)(pOVar3 + uVar2) = __position._M_node[1]._M_parent;
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::Object>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::Object>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::Object>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::Object>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::Object>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::Object>>>
                                         *)&this->sparse_elements,__position);
      } while ((_Rb_tree_header *)__position._M_node != p_Var1);
    }
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      sVar4 = 0xffffffffffffffff;
    }
    else {
      sVar4 = *(size_t *)(__position._M_node + 1);
    }
    this->min_sparse = sVar4;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }